

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall
wasm::WalkerPass<wasm::ExpressionStackWalker<wasm::AutoDrop,_wasm::Visitor<wasm::AutoDrop,_void>_>_>
::run(WalkerPass<wasm::ExpressionStackWalker<wasm::AutoDrop,_wasm::Visitor<wasm::AutoDrop,_void>_>_>
      *this,Module *module)

{
  int iVar1;
  PassOptions local_290;
  PassRunner local_1e8 [8];
  PassRunner runner;
  PassOptions local_d0;
  _Head_base<0UL,_wasm::Pass_*,_false> local_28;
  
  if ((this->super_Pass).runner == (PassRunner *)0x0) {
    __assert_fail("getPassRunner()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                  ,500,
                  "virtual void wasm::WalkerPass<wasm::ExpressionStackWalker<wasm::AutoDrop>>::run(Module *) [WalkerType = wasm::ExpressionStackWalker<wasm::AutoDrop>]"
                 );
  }
  iVar1 = (*(this->super_Pass)._vptr_Pass[4])();
  if ((char)iVar1 != '\0') {
    PassOptions::PassOptions(&local_290,(PassOptions *)((this->super_Pass).runner + 0x30));
    local_290.optimizeLevel =
         ~-(uint)(local_290.optimizeLevel < 1) & 1 |
         local_290.optimizeLevel & -(uint)(local_290.optimizeLevel < 1);
    local_290.shrinkLevel =
         ~-(uint)(local_290.shrinkLevel < 1) & 1 |
         local_290.shrinkLevel & -(uint)(local_290.shrinkLevel < 1);
    PassOptions::PassOptions(&local_d0,&local_290);
    PassRunner::PassRunner(local_1e8,module,&local_d0);
    PassOptions::~PassOptions(&local_d0);
    (*(this->super_Pass)._vptr_Pass[5])(&local_28,this);
    PassRunner::add(local_1e8,(unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_28)
    ;
    if (local_28._M_head_impl != (Pass *)0x0) {
      (*(local_28._M_head_impl)->_vptr_Pass[1])();
    }
    local_28._M_head_impl = (Pass *)0x0;
    ::wasm::PassRunner::run();
    PassRunner::~PassRunner(local_1e8);
    PassOptions::~PassOptions(&local_290);
    return;
  }
  Walker<wasm::AutoDrop,_wasm::Visitor<wasm::AutoDrop,_void>_>::walkModule
            ((Walker<wasm::AutoDrop,_wasm::Visitor<wasm::AutoDrop,_void>_> *)
             &this->
              super_ExpressionStackWalker<wasm::AutoDrop,_wasm::Visitor<wasm::AutoDrop,_void>_>,
             module);
  return;
}

Assistant:

void run(Module* module) override {
    assert(getPassRunner());
    // Parallel pass running is implemented in the PassRunner.
    if (isFunctionParallel()) {
      // Reduce opt/shrink levels to a maximum of one in nested runners like
      // these, to balance runtime. We definitely want the full levels in the
      // main passes we run, but nested pass runners are of secondary
      // importance.
      // TODO Investigate the impact of allowing the levels to just pass
      //      through. That seems to cause at least some regression in compile
      //      times in -O3, however, but with careful measurement we may find
      //      the benefits are worth it. For now -O1 is a reasonable compromise
      //      as it has basically linear runtime, unlike -O2 and -O3.
      auto options = getPassOptions();
      options.optimizeLevel = std::min(options.optimizeLevel, 1);
      options.shrinkLevel = std::min(options.shrinkLevel, 1);
      PassRunner runner(module, options);
      runner.setIsNested(true);
      runner.add(create());
      runner.run();
      return;
    }
    // Single-thread running just calls the walkModule traversal.
    WalkerType::walkModule(module);
  }